

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int RunLicense(undefined8 param_1,undefined4 param_2,undefined8 param_3,Commandline *param_4)

{
  int iVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> command;
  LicenseAccess device;
  stringstream stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  unique_ptr<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_> local_1f0;
  unique_ptr<const_long,_ResourceDeleter<const_long>_> local_1c0;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [7];
  ios_base local_118 [264];
  
  bhf::ads::LicenseAccess::LicenseAccess((LicenseAccess *)&local_1f0,param_3,param_1,param_2);
  local_198._8_8_ = 0;
  local_188[0]._M_local_buf[0] = '\0';
  local_198._0_8_ = local_198 + 0x10;
  bhf::Commandline::Pop<std::__cxx11::string>(&local_230,param_4,(string *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_230);
  if (iVar1 == 0) {
    iVar1 = bhf::ads::LicenseAccess::ShowOnlineInfo((ostream *)&local_1f0);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_230);
    if (iVar1 == 0) {
      iVar1 = bhf::ads::LicenseAccess::ShowPlatformId((ostream *)&local_1f0);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_230);
      if (iVar1 == 0) {
        iVar1 = bhf::ads::LicenseAccess::ShowSystemId((ostream *)&local_1f0);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_230);
        if (iVar1 == 0) {
          iVar1 = bhf::ads::LicenseAccess::ShowVolumeNo((ostream *)&local_1f0);
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_198);
          poVar2 = (ostream *)(local_198 + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"RunLicense",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,"(): Unknown license command \'",0x1d);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_230._M_dataplus._M_p,local_230._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
          std::__cxx11::stringbuf::str();
          Logger::Log(3,(string *)local_210);
          if (local_210[0] != local_200) {
            operator_delete(local_210[0]);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
          std::ios_base::~ios_base(local_118);
          iVar1 = -1;
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  std::unique_ptr<const_long,_ResourceDeleter<const_long>_>::~unique_ptr(&local_1c0);
  std::unique_ptr<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>::~unique_ptr(&local_1f0);
  return iVar1;
}

Assistant:

int RunLicense(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    auto device = bhf::ads::LicenseAccess{ gw, netid, port };
    const auto command = args.Pop<std::string>();

    if (!command.compare("onlineinfo")) {
        return device.ShowOnlineInfo(std::cout);
    } else if (!command.compare("platformid")) {
        return device.ShowPlatformId(std::cout);
    } else if (!command.compare("systemid")) {
        return device.ShowSystemId(std::cout);
    } else if (!command.compare("volumeno")) {
        return device.ShowVolumeNo(std::cout);
    } else {
        LOG_ERROR(__FUNCTION__ << "(): Unknown license command '" << command << "'\n");
        return -1;
    }
}